

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O2

void __thiscall
sigslot::_signal_base1<cursespp::TextLabel_*,_sigslot::multi_threaded_local>::disconnect_all
          (_signal_base1<cursespp::TextLabel_*,_sigslot::multi_threaded_local> *this)

{
  connections_list *__last;
  has_slots<sigslot::multi_threaded_local> *this_00;
  _List_node_base *p_Var1;
  lock_block<sigslot::multi_threaded_local> lock;
  lock_block<sigslot::multi_threaded_local> local_20;
  
  local_20.m_mutex = (multi_threaded_local *)this;
  (*(this->super__signal_base<sigslot::multi_threaded_local>).super_multi_threaded_local.
    _vptr_multi_threaded_local[2])();
  __last = &this->m_connected_slots;
  p_Var1 = (_List_node_base *)__last;
  while (p_Var1 = (((_List_base<sigslot::_connection_base1<cursespp::TextLabel_*,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<cursespp::TextLabel_*,_sigslot::multi_threaded_local>_*>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)__last) {
    this_00 = (has_slots<sigslot::multi_threaded_local> *)
              (**(code **)(*(long *)p_Var1[1]._M_next + 0x10))();
    has_slots<sigslot::multi_threaded_local>::signal_disconnect
              (this_00,&this->super__signal_base<sigslot::multi_threaded_local>);
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_next + 8))();
    }
  }
  std::__cxx11::
  list<sigslot::_connection_base1<cursespp::TextLabel_*,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<cursespp::TextLabel_*,_sigslot::multi_threaded_local>_*>_>
  ::erase(__last,(__last->
                 super__List_base<sigslot::_connection_base1<cursespp::TextLabel_*,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<cursespp::TextLabel_*,_sigslot::multi_threaded_local>_*>_>
                 )._M_impl._M_node.super__List_node_base._M_next,(const_iterator)__last);
  lock_block<sigslot::multi_threaded_local>::~lock_block(&local_20);
  return;
}

Assistant:

void disconnect_all()
		{
			lock_block<mt_policy> lock(this);
			const_iterator it = m_connected_slots.begin();
			const_iterator itEnd = m_connected_slots.end();

			while(it != itEnd)
			{
				(*it)->getdest()->signal_disconnect(this);
				delete *it;

				++it;
			}

			m_connected_slots.erase(m_connected_slots.begin(), m_connected_slots.end());
		}